

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O2

void __thiscall
Assimp::Collada::Animation::CombineSingleChannelAnimationsRecursively
          (Animation *this,Animation *pParent)

{
  Animation *pAVar1;
  pointer __k;
  bool bVar2;
  iterator iVar3;
  iterator __position;
  pointer ppAVar4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  childrenTargets;
  
  childrenTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &childrenTargets._M_t._M_impl.super__Rb_tree_header._M_header;
  childrenTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  childrenTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  childrenTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppAVar4 = (pParent->mSubAnims).
            super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar2 = true;
  childrenTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       childrenTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (ppAVar4 ==
        (pParent->mSubAnims).
        super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (bVar2) {
        __position._M_current =
             (pParent->mSubAnims).
             super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
        while (__position._M_current != ppAVar4) {
          pAVar1 = *__position._M_current;
          std::
          vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
          ::push_back(&pParent->mChannels,
                      (pAVar1->mChannels).
                      super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                      ._M_impl.super__Vector_impl_data._M_start);
          __position = std::
                       vector<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                       ::erase(&pParent->mSubAnims,__position._M_current);
          ~Animation(pAVar1);
          operator_delete(pAVar1,0x50);
          ppAVar4 = (pParent->mSubAnims).
                    super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&childrenTargets._M_t);
      return;
    }
    pAVar1 = *ppAVar4;
    CombineSingleChannelAnimationsRecursively(this,pAVar1);
    if ((bVar2) &&
       (__k = (pAVar1->mChannels).
              super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
              ._M_impl.super__Vector_impl_data._M_start,
       (long)(pAVar1->mChannels).
             super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)__k == 0xc0)) {
      iVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&childrenTargets._M_t,&__k->mTarget);
      if ((_Rb_tree_header *)iVar3._M_node != &childrenTargets._M_t._M_impl.super__Rb_tree_header)
      goto LAB_004024ef;
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&childrenTargets,
                 &((pAVar1->mChannels).
                   super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
                   ._M_impl.super__Vector_impl_data._M_start)->mTarget);
    }
    else {
LAB_004024ef:
      bVar2 = false;
    }
    ppAVar4 = ppAVar4 + 1;
  } while( true );
}

Assistant:

void CombineSingleChannelAnimationsRecursively(Animation *pParent)
	{
		std::set<std::string> childrenTargets;
		bool childrenAnimationsHaveDifferentChannels = true;

		for (std::vector<Animation*>::iterator it = pParent->mSubAnims.begin(); it != pParent->mSubAnims.end();)
		{
			Animation *anim = *it;
			CombineSingleChannelAnimationsRecursively(anim);

			if (childrenAnimationsHaveDifferentChannels && anim->mChannels.size() == 1 &&
				childrenTargets.find(anim->mChannels[0].mTarget) == childrenTargets.end()) {
				childrenTargets.insert(anim->mChannels[0].mTarget);
			} else {
				childrenAnimationsHaveDifferentChannels = false;
			}

			++it;
		}

		// We only want to combine animations if they have different channels
		if (childrenAnimationsHaveDifferentChannels)
		{
			for (std::vector<Animation*>::iterator it = pParent->mSubAnims.begin(); it != pParent->mSubAnims.end();)
			{
				Animation *anim = *it;

				pParent->mChannels.push_back(anim->mChannels[0]);

				it = pParent->mSubAnims.erase(it);

				delete anim;
				continue;
			}
		}
	}